

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall Population::applyMutation(Population *this)

{
  Population *this_local;
  
  CompoundMutation::getMutation(&this->mutationTree);
  this->health = ((this->mutationTree).super_MutationComponent.health + 100) * this->health;
  this->productivity =
       ((this->mutationTree).super_MutationComponent.productivity + 100) * this->productivity;
  this->health = this->health / 100;
  this->productivity = this->productivity / 100;
  switchParam(&this->size,(this->mutationTree).super_MutationComponent.size);
  switchParam(&this->safety,(this->mutationTree).super_MutationComponent.safety);
  switchParam(&this->velocity,(this->mutationTree).super_MutationComponent.velocity);
  switchParam(&this->cover,(this->mutationTree).super_MutationComponent.cover);
  return;
}

Assistant:

void Population::applyMutation() {
  mutationTree.getMutation();
  health *= (100 + mutationTree.health);
  productivity *= (100 + mutationTree.productivity);
  health /= 100;
  productivity /= 100;
  switchParam(size, mutationTree.size);
  switchParam(safety, mutationTree.safety);
  switchParam(velocity, mutationTree.velocity);
  switchParam(cover, mutationTree.cover);
}